

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall
chrono::ChFrameMoving<double>::Compute_Adtdt
          (ChFrameMoving<double> *this,ChMatrix33<double> *mA_dtdt)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_0>_>_>_>
  local_208 [16];
  undefined8 local_1f8;
  double *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 local_1c0 [16];
  double local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  double local_120;
  undefined8 local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  double local_f0;
  undefined8 local_e8;
  double local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [32];
  undefined1 local_b0 [16];
  double local_a0;
  double local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  double local_70;
  undefined8 local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  
  local_a0 = (this->coord_dtdt).rot.m_data[1];
  local_1f0 = &local_a0;
  local_1e8 = local_100;
  local_1e0 = local_160;
  local_1d8 = local_1c0;
  local_98 = (this->coord_dtdt).rot.m_data[0];
  local_60 = (this->coord_dtdt).rot.m_data[3];
  local_80 = *(undefined1 (*) [16])((this->coord_dtdt).rot.m_data + 2);
  auVar9._0_8_ = -local_60;
  auVar9._8_8_ = -local_60;
  local_90 = vunpcklpd_avx(auVar9,local_80);
  auVar10._0_8_ = -local_a0;
  auVar10._8_8_ = -local_a0;
  auVar5._0_8_ = local_80._0_8_ ^ 0x8000000000000000;
  auVar5._8_8_ = local_80._8_8_ ^ 0x8000000000000000;
  local_68 = vmovlpd_avx(auVar10);
  local_58 = vmovlpd_avx(auVar5);
  auVar5 = *(undefined1 (*) [16])(this->super_ChFrame<double>).coord.rot.m_data;
  local_e0 = (this->super_ChFrame<double>).coord.rot.m_data[2];
  local_f0 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  local_d0 = vpermilpd_avx(*(undefined1 (*) [32])(this->super_ChFrame<double>).coord.rot.m_data,6);
  local_100 = vshufpd_avx(auVar5,auVar5,1);
  auVar2._0_8_ = -local_e0;
  auVar2._8_8_ = -local_e0;
  local_e8 = vmovlpd_avx(auVar2);
  auVar3._0_8_ = -local_f0;
  auVar3._8_8_ = 0x8000000000000000;
  local_d8 = vmovlpd_avx(auVar3);
  auVar4._0_8_ = -dVar1;
  auVar4._8_8_ = -dVar1;
  local_b0 = vunpcklpd_avx(auVar4,auVar5);
  local_1b0 = (this->coord_dt).rot.m_data[3];
  local_140 = *(undefined1 (*) [16])((this->coord_dt).rot.m_data + 2);
  auVar6._0_8_ = -local_1b0;
  auVar6._8_8_ = 0x8000000000000000;
  local_150 = vunpcklpd_avx(auVar6,local_140);
  auVar8._0_8_ = local_140._0_8_ ^ 0x8000000000000000;
  auVar8._8_8_ = local_140._8_8_ ^ 0x8000000000000000;
  local_1a8 = vunpcklpd_avx(auVar8,local_140);
  local_118 = vmovlpd_avx(auVar8);
  local_180 = vshufpd_avx(local_140,local_140,1);
  local_198 = vmovlpd_avx(auVar6);
  local_190 = *(undefined1 (*) [16])(this->coord_dt).rot.m_data;
  local_1f8 = 0x4000000000000000;
  local_1c0 = vshufpd_avx(local_190,local_190,1);
  auVar7._0_8_ = -(this->coord_dt).rot.m_data[1];
  auVar7._8_8_ = 0x8000000000000000;
  local_170 = vunpcklpd_avx(auVar7,local_190);
  local_130 = vunpcklpd_avx(local_190,auVar7);
  local_160 = local_1c0;
  local_120 = local_1b0;
  local_110 = local_1c0;
  local_70 = local_98;
  local_50 = local_a0;
  local_48 = local_98;
  ChMatrix33<double>::operator=(mA_dtdt,local_208);
  return;
}

Assistant:

void Compute_Adtdt(ChMatrix33<Real>& mA_dtdt) {
        //  [A_dtdt]=2[Fp(q_dtdt)][Fm(q)]'+2[Fp(q_dt)][Fm(q_dt)]'
        ChFpMatrix34<> Fpdtdt(coord_dtdt.rot);
        ChFmMatrix34<> Fm(this->coord.rot);
        ChFpMatrix34<> Fpdt(coord_dt.rot);
        ChFmMatrix34<> Fmdt(coord_dt.rot);
        mA_dtdt = 2 * (Fpdtdt * Fm.transpose() + Fpdt * Fmdt.transpose());
    }